

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O1

void xe::writeTestResult(TestCaseResult *result,Writer *xmlWriter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Writer *pWVar4;
  char *pcVar5;
  pointer ppIVar6;
  long lVar7;
  Attribute local_110;
  Attribute local_d0;
  long *local_90 [2];
  long local_80 [2];
  Attribute local_70;
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"TestCaseResult","");
  pWVar4 = xml::Writer::operator<<(xmlWriter,(BeginElement *)local_90);
  xml::Writer::Attribute::Attribute(&local_110,"Version","0.3.3");
  pWVar4 = xml::Writer::operator<<(pWVar4,&local_110);
  xml::Writer::Attribute::Attribute(&local_d0,"CasePath",(string *)result);
  pWVar4 = xml::Writer::operator<<(pWVar4,&local_d0);
  pcVar5 = getTestCaseTypeName((result->super_TestCaseResultHeader).caseType);
  xml::Writer::Attribute::Attribute(&local_70,"CaseType",pcVar5);
  xml::Writer::operator<<(pWVar4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
    operator_delete(local_70.value._M_dataplus._M_p,local_70.value.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p,local_70.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.value._M_dataplus._M_p != &local_d0.value.field_2) {
    operator_delete(local_d0.value._M_dataplus._M_p,local_d0.value.field_2._M_allocated_capacity + 1
                   );
  }
  paVar1 = &local_d0.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.name._M_dataplus._M_p,local_d0.name.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_110.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.value._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.value._M_dataplus._M_p,
                    local_110.value.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_110.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  ppIVar6 = (result->resultItems).m_items.
            super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(result->resultItems).m_items.
                              super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3)) {
    lVar7 = 0;
    do {
      writeResultItem(ppIVar6[lVar7],xmlWriter);
      lVar7 = lVar7 + 1;
      ppIVar6 = (result->resultItems).m_items.
                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(result->resultItems).m_items.
                                         super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6)
                          >> 3));
  }
  local_d0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Result","");
  pWVar4 = xml::Writer::operator<<(xmlWriter,(BeginElement *)&local_d0);
  pcVar5 = getTestStatusCodeName((result->super_TestCaseResultHeader).statusCode);
  xml::Writer::Attribute::Attribute(&local_110,"StatusCode",pcVar5);
  pWVar4 = xml::Writer::operator<<(pWVar4,&local_110);
  pWVar4 = xml::Writer::operator<<(pWVar4,&(result->super_TestCaseResultHeader).statusDetails);
  xml::Writer::operator<<(pWVar4,(EndElementType *)&xml::Writer::EndElement);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.value._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.value._M_dataplus._M_p,
                    local_110.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.name._M_dataplus._M_p,local_d0.name.field_2._M_allocated_capacity + 1);
  }
  xml::Writer::operator<<(xmlWriter,(EndElementType *)&xml::Writer::EndElement);
  return;
}

Assistant:

void writeTestResult (const TestCaseResult& result, xe::xml::Writer& xmlWriter)
{
	using xml::Writer;

	xmlWriter << Writer::BeginElement("TestCaseResult")
			  << Writer::Attribute("Version", TEST_LOG_VERSION)
			  << Writer::Attribute("CasePath", result.casePath)
			  << Writer::Attribute("CaseType", getTestCaseTypeName(result.caseType));

	for (int ndx = 0; ndx < result.resultItems.getNumItems(); ndx++)
		writeResultItem(result.resultItems.getItem(ndx), xmlWriter);

	// Result item is not logged until end.
	xmlWriter << Writer::BeginElement("Result")
			  << Writer::Attribute("StatusCode", getTestStatusCodeName(result.statusCode))
			  << result.statusDetails
			  << Writer::EndElement;

	xmlWriter << Writer::EndElement;
}